

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementSlot
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot fieldRegSlot,RegSlot regSlot,
          int32 slotId,ProfileId profileId)

{
  undefined1 *puVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyKind propertyKind;
  DWORD DVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  FunctionInfoPtrPtr address;
  AddrOpnd *src1Opnd;
  Opnd *pOVar7;
  RegOpnd *pRVar8;
  IntConstOpnd *pIVar9;
  RegOpnd *pRVar10;
  StackSym *sym;
  RegOpnd *src2Opnd;
  PropertySym *sym_00;
  SymOpnd *pSVar11;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  Func *func;
  OpCode local_50;
  uint32 local_38;
  bool local_31 [8];
  bool isLdSlotThatWasNotProfiled;
  
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xd74,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) goto LAB_00495297;
    *puVar6 = 0;
  }
  local_31[0] = false;
  sym = (StackSym *)0x0;
  switch(newOpcode) {
  case NewInnerScFunc:
    local_50 = NewScFunc;
    break;
  case NewInnerScGenFunc:
    local_50 = NewScGenFunc;
    sym = (StackSym *)0x0;
    break;
  case NewInnerStackScFunc:
    local_50 = NewScFunc;
    sym = EnsureStackFuncPtrSym(this);
    break;
  case NewScGenFuncHomeObj:
switchD_00494d21_caseD_169:
    this_00 = Func::GetJITFunctionBody(this->m_func);
    address = JITTimeFunctionBody::GetNestedFuncRef(this_00,slotId);
    src1Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
    pOVar7 = GetEnvironmentOperand(this,offset);
    pRVar12 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
    pRVar8 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar10->super_Opnd,&pRVar12->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar12->super_Opnd,&src1Opnd->super_Opnd,pIVar13->m_dst,
                             this->m_func);
    AddInstr(this,pIVar13,offset);
    pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar12->super_Opnd,pOVar7,pIVar13->m_dst,this->m_func);
    AddInstr(this,pIVar13,offset);
    pIVar13 = IR::Instr::New(newOpcode,&pRVar8->super_Opnd,pIVar13->m_dst,this->m_func);
    goto LAB_00495073;
  default:
    local_38 = offset;
    if (newOpcode - 0x1f7 < 2) {
      pSVar11 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,slotId,0xffffffff,PropertyKindSlots,
                               0xffffffff);
LAB_0049513f:
      pRVar12 = BuildSrcOpnd(this,regSlot,TyVar);
      pIVar13 = IR::Instr::New(newOpcode,&pSVar11->super_Opnd,&pRVar12->super_Opnd,this->m_func);
      if (newOpcode == StSlotChkUndecl) {
        IR::Instr::SetSrc2(pIVar13,&pSVar11->super_Opnd);
      }
      goto LAB_004951f8;
    }
    if (newOpcode == LdSlot) {
      propertyKind = PropertyKindSlots;
LAB_00495181:
      pSVar11 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,slotId,0xffffffff,propertyKind,0xffffffff
                              );
    }
    else {
      if (newOpcode == NewScFuncHomeObj) goto switchD_00494d21_caseD_169;
      if (newOpcode == LdObjSlot) {
        newOpcode = LdSlot;
      }
      else if (newOpcode == StObjSlot) {
        sym = (StackSym *)&DAT_00000001;
        newOpcode = StSlot;
      }
      else {
        if (newOpcode != StObjSlotChkUndecl) {
          if (newOpcode == StPropIdArrFromVar) {
            pRVar12 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
            pRVar8 = BuildSrcOpnd(this,regSlot,TyVar);
            pIVar9 = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,false);
            pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
            pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar10->super_Opnd,&pRVar8->super_Opnd,
                                     this->m_func);
            AddInstr(this,pIVar13,offset);
            pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
            pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pIVar9->super_Opnd,
                                     pIVar13->m_dst,this->m_func);
            AddInstr(this,pIVar13,0xffffffff);
            pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
            pIVar13 = IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pRVar12->super_Opnd,
                                     pIVar13->m_dst,this->m_func);
            local_38 = 0xffffffff;
            AddInstr(this,pIVar13,0xffffffff);
            pOVar7 = pIVar13->m_dst;
            pIVar13 = IR::Instr::New(StPropIdArrFromVar,this->m_func);
            IR::Instr::SetSrc1(pIVar13,pOVar7);
            goto LAB_004951f8;
          }
          if (newOpcode != LdSlotArr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0xe17,"((0))","Unknown ElementSlot opcode");
            if (bVar4) {
              *puVar6 = 0;
              Js::Throw::FatalInternalError(-0x7fffbffb);
            }
LAB_00495297:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          propertyKind = PropertyKindSlotArray;
          goto LAB_00495181;
        }
        sym = (StackSym *)&DAT_00000001;
        newOpcode = StSlotChkUndecl;
      }
      pRVar12 = IR::RegOpnd::New(TyVar,this->m_func);
      DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
      pSVar11 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,DVar5 >> 3,0xffffffff,
                               PropertyKindSlotArray,0xffffffff);
      pIVar13 = IR::Instr::New(LdSlotArr,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
      AddInstr(this,pIVar13,offset);
      sym_00 = PropertySym::New(pRVar12->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                                this->m_func);
      pSVar11 = IR::SymOpnd::New(&sym_00->super_Sym,TyVar,this->m_func);
      if ((char)sym != '\0') goto LAB_0049513f;
    }
    pRVar12 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    if ((profileId == 0xffff) ||
       (pIVar13 = BuildProfiledSlotLoad(this,newOpcode,pRVar12,pSVar11,profileId,local_31),
       pIVar13 == (Instr *)0x0)) {
      pIVar13 = IR::Instr::New(newOpcode,&pRVar12->super_Opnd,&pSVar11->super_Opnd,this->m_func);
    }
LAB_004951f8:
    AddInstr(this,pIVar13,local_38);
    if ((local_31[0] == true) && (bVar4 = DoBailOnNoProfile(this), bVar4)) {
      InsertBailOnNoProfile(this,pIVar13);
      return;
    }
    return;
  }
  pIVar9 = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,true);
  pRVar12 = BuildSrcOpnd(this,fieldRegSlot,TyVar);
  pRVar8 = BuildDstOpnd(this,regSlot,TyVar,false,false);
  func = this->m_func;
  if (sym != (StackSym *)0x0) {
    pRVar10 = IR::RegOpnd::New(TyVar,func);
    src2Opnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
    pIVar13 = IR::Instr::New(NewScFuncData,&pRVar10->super_Opnd,&pRVar12->super_Opnd,
                             &src2Opnd->super_Opnd,this->m_func);
    AddInstr(this,pIVar13,offset);
    func = this->m_func;
    pRVar12 = pRVar10;
  }
  pIVar13 = IR::Instr::New(local_50,&pRVar8->super_Opnd,&pIVar9->super_Opnd,&pRVar12->super_Opnd,
                           func);
LAB_00495073:
  uVar2 = *(uint *)&pRVar8->m_sym->field_0x18;
  if ((uVar2 & 1) != 0) {
    *(uint *)&pRVar8->m_sym->field_0x18 = uVar2 | 4;
    puVar1 = &pRVar8->m_sym->field_0x18;
    *(uint *)puVar1 = *(uint *)puVar1 | 2;
  }
  AddInstr(this,pIVar13,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementSlot(Js::OpCode newOpcode, uint32 offset, Js::RegSlot fieldRegSlot, Js::RegSlot regSlot,
    int32 slotId, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IR::RegOpnd * regOpnd;

    IR::SymOpnd *   fieldSymOpnd;
    PropertyKind    propertyKind = PropertyKindSlots;
    PropertySym *   fieldSym;
    StackSym *      stackFuncPtrSym = nullptr;
    bool isLdSlotThatWasNotProfiled = false;

    switch (newOpcode)
    {
    case Js::OpCode::NewInnerStackScFunc:
        stackFuncPtrSym = this->EnsureStackFuncPtrSym();
        // fall through
    case Js::OpCode::NewInnerScFunc:
        newOpcode = Js::OpCode::NewScFunc;
        goto NewScFuncCommon;

    case Js::OpCode::NewInnerScGenFunc:
        newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
    {
        IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);
        IR::Opnd * environmentOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);
        if (stackFuncPtrSym)
        {
             IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
             instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
             this->AddInstr(instr, offset);

            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
        }
        else
        {
            instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
        }
        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    {
        Js::FunctionInfoPtrPtr infoRef = m_func->GetJITFunctionBody()->GetNestedFuncRef(slotId);
        IR::AddrOpnd * functionBodySlotOpnd = IR::AddrOpnd::New((Js::Var)infoRef, IR::AddrOpndKindDynamicMisc, m_func);
        IR::Opnd * environmentOpnd = GetEnvironmentOperand(offset);
        IR::Opnd * homeObjOpnd = this->BuildSrcOpnd(fieldRegSlot);
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), homeObjOpnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), functionBodySlotOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), environmentOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(newOpcode, regOpnd, instr->GetDst(), m_func);

        if (regOpnd->m_sym->m_isSingleDef)
        {
            regOpnd->m_sym->m_isSafeThis = true;
            regOpnd->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    case Js::OpCode::LdObjSlot:
        newOpcode = Js::OpCode::LdSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlot:
        newOpcode = Js::OpCode::StSlot;
        goto ObjSlotCommon;

    case Js::OpCode::StObjSlotChkUndecl:
        newOpcode = Js::OpCode::StSlotChkUndecl;

ObjSlotCommon:
        regOpnd = IR::RegOpnd::New(TyVar, m_func);
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
        instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldSymOpnd, m_func);
        this->AddInstr(instr, offset);

        fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
        fieldSymOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

        if (newOpcode == Js::OpCode::StSlot || newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            goto StSlotCommon;
        }
        goto LdSlotCommon;

    case Js::OpCode::LdSlotArr:
        propertyKind = PropertyKindSlotArray;
    case Js::OpCode::LdSlot:
        // Load
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

LdSlotCommon:
        regOpnd = this->BuildDstOpnd(regSlot);

        instr = nullptr;
        if (profileId != Js::Constants::NoProfileId)
        {
            instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldSymOpnd, profileId, &isLdSlotThatWasNotProfiled);
        }
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }
        break;

    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
        // Store
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, slotId, (Js::PropertyIdIndexType)-1, propertyKind);

StSlotCommon:
        regOpnd = this->BuildSrcOpnd(regSlot);

        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        if (newOpcode == Js::OpCode::StSlotChkUndecl)
        {
            // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
            instr->SetSrc2(fieldSymOpnd);
        }
        break;

    case Js::OpCode::StPropIdArrFromVar:
    {
        IR::RegOpnd *   src0Opnd = this->BuildSrcOpnd(fieldRegSlot);
        IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(regSlot);
        IntConstType    value = slotId;
        IR::IntConstOpnd * valOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, m_func);
        this->AddInstr(instr, offset);
        offset = Js::Constants::NoByteCodeOffset;

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), valOpnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, offset);

        IR::Opnd * firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementSlot opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}